

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

IntRect * __thiscall
ClipperLib::ClipperBase::GetBounds(IntRect *__return_storage_ptr__,ClipperBase *this)

{
  TEdge *pTVar1;
  TEdge *bottomE;
  TEdge *e;
  LocalMinima *lm;
  ClipperBase *this_local;
  
  e = (TEdge *)this->m_MinimaList;
  if (e == (TEdge *)0x0) {
    __return_storage_ptr__->bottom = 0;
    __return_storage_ptr__->right = 0;
    __return_storage_ptr__->top = 0;
    __return_storage_ptr__->left = 0;
  }
  else {
    __return_storage_ptr__->left = ((TEdge *)e->ybot)->xbot;
    __return_storage_ptr__->top = ((TEdge *)e->ybot)->ybot;
    __return_storage_ptr__->right = ((TEdge *)e->ybot)->xbot;
    __return_storage_ptr__->bottom = ((TEdge *)e->ybot)->ybot;
    for (; e != (TEdge *)0x0; e = (TEdge *)e->ycurr) {
      if (__return_storage_ptr__->bottom < *(long *)(e->ybot + 8)) {
        __return_storage_ptr__->bottom = *(long64 *)(e->ybot + 8);
      }
      bottomE = (TEdge *)e->ybot;
      pTVar1 = bottomE;
      while( true ) {
        for (; bottomE->nextInLML != (TEdge *)0x0; bottomE = bottomE->nextInLML) {
          if (bottomE->xbot < __return_storage_ptr__->left) {
            __return_storage_ptr__->left = bottomE->xbot;
          }
          if (__return_storage_ptr__->right < bottomE->xbot) {
            __return_storage_ptr__->right = bottomE->xbot;
          }
        }
        if (bottomE->xbot < __return_storage_ptr__->left) {
          __return_storage_ptr__->left = bottomE->xbot;
        }
        if (__return_storage_ptr__->right < bottomE->xbot) {
          __return_storage_ptr__->right = bottomE->xbot;
        }
        if (bottomE->xtop < __return_storage_ptr__->left) {
          __return_storage_ptr__->left = bottomE->xtop;
        }
        if (__return_storage_ptr__->right < bottomE->xtop) {
          __return_storage_ptr__->right = bottomE->xtop;
        }
        if (bottomE->ytop < __return_storage_ptr__->top) {
          __return_storage_ptr__->top = bottomE->ytop;
        }
        if (pTVar1 != (TEdge *)e->ybot) break;
        bottomE = (TEdge *)e->xcurr;
        pTVar1 = bottomE;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IntRect ClipperBase::GetBounds()
{
  IntRect result;
  LocalMinima* lm = m_MinimaList;
  if (!lm)
  {
    result.left = result.top = result.right = result.bottom = 0;
    return result;
  }
  result.left = lm->leftBound->xbot;
  result.top = lm->leftBound->ybot;
  result.right = lm->leftBound->xbot;
  result.bottom = lm->leftBound->ybot;
  while (lm)
  {
    if (lm->leftBound->ybot > result.bottom)
      result.bottom = lm->leftBound->ybot;
    TEdge* e = lm->leftBound;
    for (;;) {
      TEdge* bottomE = e;
      while (e->nextInLML)
      {
        if (e->xbot < result.left) result.left = e->xbot;
        if (e->xbot > result.right) result.right = e->xbot;
        e = e->nextInLML;
      }
      if (e->xbot < result.left) result.left = e->xbot;
      if (e->xbot > result.right) result.right = e->xbot;
      if (e->xtop < result.left) result.left = e->xtop;
      if (e->xtop > result.right) result.right = e->xtop;
      if (e->ytop < result.top) result.top = e->ytop;

      if (bottomE == lm->leftBound) e = lm->rightBound;
      else break;
    }
    lm = lm->next;
  }
  return result;
}